

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase * AnalyzeTypeSimple(ExpressionContext *ctx,SynTypeSimple *syntax)

{
  TypeBase *pTVar1;
  int iVar2;
  TypeBase *pTVar3;
  undefined4 extraout_var;
  ExprBase *pEVar5;
  TypeBase *pTVar4;
  
  pTVar3 = AnalyzeType(ctx,&syntax->super_SynBase,false,(bool *)0x0);
  pTVar4 = pTVar3;
  if (pTVar3 != (TypeBase *)0x0) {
    if (pTVar3 == ctx->typeAuto) {
      anon_unknown.dwarf_9fd58::Stop
                (ctx,&syntax->super_SynBase,"ERROR: cannot take typeid from auto type");
    }
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    pTVar4 = (TypeBase *)CONCAT44(extraout_var,iVar2);
    pTVar1 = ctx->typeTypeID;
    pTVar4->typeID = 8;
    (pTVar4->name).begin = (char *)syntax;
    (pTVar4->name).end = (char *)pTVar1;
    pTVar4->importModule = (ModuleData *)0x0;
    *(undefined1 *)&pTVar4->typeIndex = 0;
    pTVar4->_vptr_TypeBase = (_func_int **)&PTR__ExprBase_00229580;
    pTVar4->size = (longlong)pTVar3;
  }
  if (pTVar3 != (TypeBase *)0x0) {
    return (ExprBase *)pTVar4;
  }
  pEVar5 = AnalyzeVariableAccess(ctx,syntax);
  return pEVar5;
}

Assistant:

ExprBase* AnalyzeTypeSimple(ExpressionContext &ctx, SynTypeSimple *syntax)
{
	// It could be a typeid
	if(TypeBase *type = AnalyzeType(ctx, syntax, false))
	{
		if(type == ctx.typeAuto)
			Stop(ctx, syntax, "ERROR: cannot take typeid from auto type");

		return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(syntax, ctx.typeTypeID, type);
	}

	return AnalyzeVariableAccess(ctx, syntax);
}